

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvkgen.cpp
# Opt level: O2

void __thiscall VkSpecParser::parseFeatureRequire(VkSpecParser *this,QString *versionDefine)

{
  char cVar1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  QList<QString> *this_00;
  QXmlStreamAttribute *attr;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 local_a0 [8];
  char16_t *pcStack_98;
  qsizetype local_90;
  QStringView local_88;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<QXmlStreamAttribute> local_60;
  QStringView local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  while( true ) {
    cVar1 = QXmlStreamReader::atEnd();
    if (cVar1 != '\0') break;
    QXmlStreamReader::readNext();
    bVar2 = QXmlStreamReader::isEndElement(&this->m_reader);
    if (bVar2) {
      auVar5 = QXmlStreamReader::name();
      local_60.d = (Data *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      local_60.ptr = (QXmlStreamAttribute *)0x10a108;
      local_60.size = 7;
      local_48.m_size = 7;
      local_48.m_data = L"require";
      _local_a0 = auVar5;
      bVar2 = comparesEqual((QStringView *)local_a0,&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      if (bVar2) break;
    }
    bVar2 = QXmlStreamReader::isStartElement(&this->m_reader);
    if (bVar2) {
      auVar5 = QXmlStreamReader::name();
      local_60.d = (Data *)0x0;
      local_78.d = (Data *)0x0;
      local_78.ptr = (char16_t *)0x0;
      local_78.size = 0;
      local_60.ptr = (QXmlStreamAttribute *)0x10a118;
      local_60.size = 7;
      local_48.m_size = 7;
      local_48.m_data = L"command";
      _local_a0 = auVar5;
      bVar2 = comparesEqual((QStringView *)local_a0,&local_48);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_60);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
      if (bVar2) {
        QXmlStreamReader::attributes();
        iVar3 = QList<QXmlStreamAttribute>::begin((QList<QXmlStreamAttribute> *)&local_60);
        iVar4 = QList<QXmlStreamAttribute>::end((QList<QXmlStreamAttribute> *)&local_60);
        for (; iVar3.i != iVar4.i; iVar3.i = iVar3.i + 1) {
          local_48.m_data = ((iVar3.i)->m_name).m_string.ptr;
          local_48.m_size = ((iVar3.i)->m_name).m_string.size;
          local_78.d = (Data *)0x0;
          local_a0 = (undefined1  [8])0x0;
          pcStack_98 = (char16_t *)0x0;
          local_90 = 0;
          local_78.ptr = L"name";
          local_78.size = 4;
          local_88.m_size = 4;
          local_88.m_data = L"name";
          bVar2 = comparesEqual(&local_48,&local_88);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a0);
          if (bVar2) {
            this_00 = QMap<QString,_QList<QString>_>::operator[]
                                (&this->m_versionCommandMapping,versionDefine);
            local_48.m_data = ((iVar3.i)->m_value).m_string.ptr;
            local_48.m_size = ((iVar3.i)->m_value).m_string.size;
            QStringView::toString((QString *)local_a0,&local_48);
            QString::trimmed_helper((QString *)&local_78);
            QList<QString>::emplaceBack<QString>(this_00,(QString *)&local_78);
            QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
            QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_a0)
            ;
          }
        }
        QArrayDataPointer<QXmlStreamAttribute>::~QArrayDataPointer(&local_60);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VkSpecParser::parseFeatureRequire(const QString &versionDefine)
{
    // <require comment="Device initialization">
    //   <command name="vkCreateInstance"/>

    while (!m_reader.atEnd()) {
        m_reader.readNext();
        if (m_reader.isEndElement() && m_reader.name() == QStringLiteral("require"))
            return;
        if (m_reader.isStartElement() && m_reader.name() == QStringLiteral("command")) {
            for (const QXmlStreamAttribute &attr : m_reader.attributes()) {
                if (attr.name() == QStringLiteral("name"))
                    m_versionCommandMapping[versionDefine].append(attr.value().toString().trimmed());
            }
        }
    }
}